

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void duckdb::QuantileScalarOperation<false,duckdb::QuantileStandardType>::
     Finalize<duckdb::timestamp_t,duckdb::QuantileState<duckdb::timestamp_t,duckdb::QuantileStandardType>>
               (QuantileState<duckdb::timestamp_t,_duckdb::QuantileStandardType> *state,
               timestamp_t *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  reference pvVar2;
  timestamp_t tVar3;
  int64_t *in_RSI;
  vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *in_RDI;
  Interpolator<false> interp;
  QuantileBindData *bind_data;
  size_type in_stack_ffffffffffffff98;
  vector<duckdb::QuantileValue,_true> *in_stack_ffffffffffffffa0;
  QuantileValue *in_stack_ffffffffffffffa8;
  Interpolator<false> *in_stack_ffffffffffffffb0;
  AggregateFinalizeData *in_stack_ffffffffffffffe0;
  undefined1 desc_p;
  
  bVar1 = ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::empty
                    ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)
                     in_stack_ffffffffffffffb0);
  if (bVar1) {
    AggregateFinalizeData::ReturnNull(in_stack_ffffffffffffffe0);
  }
  else {
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffa0);
    FunctionData::Cast<duckdb::QuantileBindData>((FunctionData *)in_stack_ffffffffffffffa0);
    pvVar2 = vector<duckdb::QuantileValue,_true>::operator[]
                       (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    desc_p = (undefined1)((ulong)pvVar2 >> 0x38);
    ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::size(in_RDI);
    Interpolator<false>::Interpolator
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(idx_t)in_stack_ffffffffffffffa0,
               (bool)desc_p);
    ::std::vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_>::data
              ((vector<duckdb::timestamp_t,_std::allocator<duckdb::timestamp_t>_> *)0x1d78905);
    tVar3 = Interpolator<false>::
            Operation<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::QuantileDirect<duckdb::timestamp_t>>
                      ((Interpolator<false> *)bind_data,(timestamp_t *)interp.end,
                       (Vector *)interp.begin,(QuantileDirect<duckdb::timestamp_t> *)interp.CRN);
    *in_RSI = tVar3.value;
  }
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.v.empty()) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(finalize_data.input.bind_data);
		auto &bind_data = finalize_data.input.bind_data->Cast<QuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		Interpolator<DISCRETE> interp(bind_data.quantiles[0], state.v.size(), bind_data.desc);
		target = interp.template Operation<typename STATE::InputType, T>(state.v.data(), finalize_data.result);
	}